

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DuplicateFunctionElimination.cpp
# Opt level: O2

void __thiscall
wasm::DuplicateFunctionElimination::~DuplicateFunctionElimination
          (DuplicateFunctionElimination *this)

{
  Pass::~Pass(&this->super_Pass);
  operator_delete(this,0x30);
  return;
}

Assistant:

bool invalidatesDWARF() override { return true; }